

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Library.cpp
# Opt level: O3

void __thiscall AGSMock::Library::~Library(Library *this)

{
  if (this->handle == (void *)0x0) {
    return;
  }
  dlclose();
  return;
}

Assistant:

Library::~Library()
{
	if (handle != nullptr)
	{
	#ifdef _WIN32
		FreeLibrary((HMODULE) handle);
	#else
		dlclose(handle);
	#endif
	}
}